

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O1

bool Catch::list(IEventListener *reporter,Config *config)

{
  key_type *pkVar1;
  long lVar2;
  long *plVar3;
  _Base_ptr p_Var4;
  int iVar5;
  int iVar6;
  undefined4 extraout_var;
  Singleton<Catch::(anonymous_namespace)::RegistryHub,_Catch::IRegistryHub,_Catch::IMutableRegistryHub>
  *pSVar7;
  undefined4 extraout_var_00;
  vector<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_> *pvVar8;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  pointer pTVar9;
  iterator iVar10;
  _Rb_tree_node_base *p_Var11;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  char *__function;
  key_type *__k;
  char cVar12;
  Config *pCVar13;
  long *plVar14;
  pair<std::_Rb_tree_iterator<std::pair<const_Catch::StringRef,_Catch::TagInfo>_>,_bool> pVar15;
  StringRef SVar16;
  vector<Catch::ReporterDescription,_std::allocator<Catch::ReporterDescription>_> descriptions;
  vector<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_> matchedTestCases;
  map<Catch::StringRef,_Catch::TagInfo,_Catch::Detail::CaseInsensitiveLess,_std::allocator<std::pair<const_Catch::StringRef,_Catch::TagInfo>_>_>
  tagCounts;
  undefined1 local_118 [16];
  undefined1 local_108 [16];
  undefined1 local_f8 [16];
  _Rb_tree_node_base local_e8;
  undefined1 local_c8 [8];
  _Rb_tree_node_base _Stack_c0;
  size_t sStack_a0;
  undefined8 local_98;
  Config *local_90;
  pointer local_88;
  pointer local_80;
  vector<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_> local_78;
  _Rb_tree<Catch::StringRef,_std::pair<const_Catch::StringRef,_Catch::TagInfo>,_std::_Select1st<std::pair<const_Catch::StringRef,_Catch::TagInfo>_>,_Catch::Detail::CaseInsensitiveLess,_std::allocator<std::pair<const_Catch::StringRef,_Catch::TagInfo>_>_>
  local_60;
  
  cVar12 = (config->m_data).listTests;
  if ((bool)cVar12 == true) {
    iVar5 = (*(config->super_IConfig)._vptr_IConfig[0xd])(config);
    pSVar7 = Singleton<Catch::(anonymous_namespace)::RegistryHub,_Catch::IRegistryHub,_Catch::IMutableRegistryHub>
             ::getInternal();
    iVar6 = (*(pSVar7->super_RegistryHub).super_IRegistryHub._vptr_IRegistryHub[3])(pSVar7);
    pvVar8 = (vector<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_> *)
             (**(code **)(*(long *)CONCAT44(extraout_var_00,iVar6) + 0x20))
                       ((long *)CONCAT44(extraout_var_00,iVar6),config);
    filterTests((vector<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_> *)local_118,
                pvVar8,(TestSpec *)CONCAT44(extraout_var,iVar5),&config->super_IConfig);
    (*reporter->_vptr_IEventListener[0x16])(reporter,local_118);
    if ((pointer)local_118._0_8_ != (pointer)0x0) {
      operator_delete((void *)local_118._0_8_,local_108._0_8_ - local_118._0_8_);
    }
  }
  local_e8._M_right = (_Base_ptr)reporter;
  local_90 = config;
  if ((config->m_data).listTags == true) {
    iVar5 = (*(config->super_IConfig)._vptr_IConfig[0xd])(config);
    pSVar7 = Singleton<Catch::(anonymous_namespace)::RegistryHub,_Catch::IRegistryHub,_Catch::IMutableRegistryHub>
             ::getInternal();
    iVar6 = (*(pSVar7->super_RegistryHub).super_IRegistryHub._vptr_IRegistryHub[3])(pSVar7);
    pvVar8 = (vector<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_> *)
             (**(code **)(*(long *)CONCAT44(extraout_var_02,iVar6) + 0x20))
                       ((long *)CONCAT44(extraout_var_02,iVar6),config);
    filterTests(&local_78,pvVar8,(TestSpec *)CONCAT44(extraout_var_01,iVar5),&config->super_IConfig)
    ;
    local_60._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_60._M_impl.super__Rb_tree_header._M_header;
    local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_88 = local_78.
               super__Vector_base<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>.
               _M_impl.super__Vector_impl_data._M_finish;
    local_60._M_impl.super__Rb_tree_header._M_header._M_right =
         local_60._M_impl.super__Rb_tree_header._M_header._M_left;
    if (local_78.super__Vector_base<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>.
        _M_impl.super__Vector_impl_data._M_start !=
        local_78.super__Vector_base<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>.
        _M_impl.super__Vector_impl_data._M_finish) {
      pTVar9 = local_78.
               super__Vector_base<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>.
               _M_impl.super__Vector_impl_data._M_start;
      do {
        pkVar1 = &((pTVar9->m_info->tags).
                   super__Vector_base<Catch::Tag,_std::allocator<Catch::Tag>_>._M_impl.
                   super__Vector_impl_data._M_finish)->original;
        local_80 = pTVar9;
        for (__k = &((pTVar9->m_info->tags).
                     super__Vector_base<Catch::Tag,_std::allocator<Catch::Tag>_>._M_impl.
                     super__Vector_impl_data._M_start)->original; __k != pkVar1; __k = __k + 1) {
          iVar10 = std::
                   _Rb_tree<Catch::StringRef,_std::pair<const_Catch::StringRef,_Catch::TagInfo>,_std::_Select1st<std::pair<const_Catch::StringRef,_Catch::TagInfo>_>,_Catch::Detail::CaseInsensitiveLess,_std::allocator<std::pair<const_Catch::StringRef,_Catch::TagInfo>_>_>
                   ::find(&local_60,__k);
          if ((_Rb_tree_header *)iVar10._M_node == &local_60._M_impl.super__Rb_tree_header) {
            _Stack_c0._M_parent = (_Base_ptr)0x0;
            local_c8 = (undefined1  [8])0x0;
            _Stack_c0._0_8_ = (pointer)0x0;
            _Stack_c0._M_left = &_Stack_c0;
            sStack_a0 = 0;
            local_98 = 0;
            local_118._0_8_ = __k->m_start;
            local_118._8_8_ = __k->m_size;
            local_108._8_4_ = _S_red;
            local_f8._0_8_ = (_Rb_tree_node_base *)0x0;
            local_f8._8_8_ = local_108 + 8;
            local_e8._M_parent = (_Base_ptr)0x0;
            local_e8._M_left = (_Base_ptr)0x0;
            local_e8._0_8_ = local_f8._8_8_;
            _Stack_c0._M_right = _Stack_c0._M_left;
            pVar15 = std::
                     _Rb_tree<Catch::StringRef,std::pair<Catch::StringRef_const,Catch::TagInfo>,std::_Select1st<std::pair<Catch::StringRef_const,Catch::TagInfo>>,Catch::Detail::CaseInsensitiveLess,std::allocator<std::pair<Catch::StringRef_const,Catch::TagInfo>>>
                     ::_M_emplace_unique<std::pair<Catch::StringRef,Catch::TagInfo>>
                               ((_Rb_tree<Catch::StringRef,std::pair<Catch::StringRef_const,Catch::TagInfo>,std::_Select1st<std::pair<Catch::StringRef_const,Catch::TagInfo>>,Catch::Detail::CaseInsensitiveLess,std::allocator<std::pair<Catch::StringRef_const,Catch::TagInfo>>>
                                 *)&local_60,(pair<Catch::StringRef,_Catch::TagInfo> *)local_118);
            iVar10._M_node = (_Base_ptr)pVar15.first._M_node;
            std::
            _Rb_tree<Catch::StringRef,_Catch::StringRef,_std::_Identity<Catch::StringRef>,_std::less<Catch::StringRef>,_std::allocator<Catch::StringRef>_>
            ::~_Rb_tree((_Rb_tree<Catch::StringRef,_Catch::StringRef,_std::_Identity<Catch::StringRef>,_std::less<Catch::StringRef>,_std::allocator<Catch::StringRef>_>
                         *)local_108);
            std::
            _Rb_tree<Catch::StringRef,_Catch::StringRef,_std::_Identity<Catch::StringRef>,_std::less<Catch::StringRef>,_std::allocator<Catch::StringRef>_>
            ::~_Rb_tree((_Rb_tree<Catch::StringRef,_Catch::StringRef,_std::_Identity<Catch::StringRef>,_std::less<Catch::StringRef>,_std::allocator<Catch::StringRef>_>
                         *)local_c8);
          }
          local_118._0_8_ = __k->m_start;
          local_118._8_8_ = __k->m_size;
          *(long *)(iVar10._M_node + 3) = *(long *)(iVar10._M_node + 3) + 1;
          std::
          _Rb_tree<Catch::StringRef,Catch::StringRef,std::_Identity<Catch::StringRef>,std::less<Catch::StringRef>,std::allocator<Catch::StringRef>>
          ::_M_insert_unique<Catch::StringRef_const&>
                    ((_Rb_tree<Catch::StringRef,Catch::StringRef,std::_Identity<Catch::StringRef>,std::less<Catch::StringRef>,std::allocator<Catch::StringRef>>
                      *)&iVar10._M_node[1]._M_left,(StringRef *)local_118);
        }
        pTVar9 = local_80 + 1;
      } while (pTVar9 != local_88);
    }
    local_118._0_8_ = (pointer)0x0;
    local_118._8_8_ = (pointer)0x0;
    local_108._0_8_ = (pointer)0x0;
    std::vector<Catch::TagInfo,_std::allocator<Catch::TagInfo>_>::reserve
              ((vector<Catch::TagInfo,_std::allocator<Catch::TagInfo>_> *)local_118,
               local_60._M_impl.super__Rb_tree_header._M_node_count);
    p_Var4 = local_e8._M_right;
    p_Var11 = local_60._M_impl.super__Rb_tree_header._M_header._M_left;
    if ((_Rb_tree_header *)local_60._M_impl.super__Rb_tree_header._M_header._M_left !=
        &local_60._M_impl.super__Rb_tree_header) {
      do {
        std::vector<Catch::TagInfo,_std::allocator<Catch::TagInfo>_>::emplace_back<Catch::TagInfo>
                  ((vector<Catch::TagInfo,_std::allocator<Catch::TagInfo>_> *)local_118,
                   (TagInfo *)&p_Var11[1]._M_left);
        p_Var11 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var11);
      } while ((_Rb_tree_header *)p_Var11 != &local_60._M_impl.super__Rb_tree_header);
    }
    (**(code **)(*(long *)p_Var4 + 0xb8))(p_Var4,local_118);
    std::vector<Catch::TagInfo,_std::allocator<Catch::TagInfo>_>::~vector
              ((vector<Catch::TagInfo,_std::allocator<Catch::TagInfo>_> *)local_118);
    std::
    _Rb_tree<Catch::StringRef,_std::pair<const_Catch::StringRef,_Catch::TagInfo>,_std::_Select1st<std::pair<const_Catch::StringRef,_Catch::TagInfo>_>,_Catch::Detail::CaseInsensitiveLess,_std::allocator<std::pair<const_Catch::StringRef,_Catch::TagInfo>_>_>
    ::~_Rb_tree(&local_60);
    if (local_78.super__Vector_base<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_78.
                      super__Vector_base<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_78.
                            super__Vector_base<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_78.
                            super__Vector_base<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    cVar12 = '\x01';
  }
  pCVar13 = local_90;
  if ((local_90->m_data).listReporters == true) {
    local_c8 = (undefined1  [8])0x0;
    _Stack_c0._0_8_ = (pointer)0x0;
    _Stack_c0._M_parent = (_Base_ptr)0x0;
    pSVar7 = Singleton<Catch::(anonymous_namespace)::RegistryHub,_Catch::IRegistryHub,_Catch::IMutableRegistryHub>
             ::getInternal();
    iVar5 = (*(pSVar7->super_RegistryHub).super_IRegistryHub._vptr_IRegistryHub[2])(pSVar7);
    lVar2 = *(long *)CONCAT44(extraout_var_03,iVar5);
    if (lVar2 == 0) goto LAB_0014d3a7;
    std::vector<Catch::ReporterDescription,_std::allocator<Catch::ReporterDescription>_>::reserve
              ((vector<Catch::ReporterDescription,_std::allocator<Catch::ReporterDescription>_> *)
               local_c8,*(size_type *)(lVar2 + 0x40));
    p_Var11 = *(_Rb_tree_node_base **)(lVar2 + 0x30);
    if (p_Var11 != (_Rb_tree_node_base *)(lVar2 + 0x20)) {
      do {
        local_118._0_8_ = (pointer)local_108;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_118,*(long *)(p_Var11 + 1),
                   (long)&(p_Var11[1]._M_parent)->_M_color + *(long *)(p_Var11 + 1));
        SVar16.m_size = local_118._8_8_;
        SVar16.m_start = (char *)local_118._0_8_;
        if (*(long **)(p_Var11 + 2) == (long *)0x0) {
          __function = 
          "const T *Catch::Detail::unique_ptr<Catch::IReporterFactory>::operator->() const [T = Catch::IReporterFactory]"
          ;
          goto LAB_0014d39d;
        }
        (**(code **)(**(long **)(p_Var11 + 2) + 0x18))(local_f8);
        std::vector<Catch::ReporterDescription,_std::allocator<Catch::ReporterDescription>_>::
        emplace_back<Catch::ReporterDescription>
                  ((vector<Catch::ReporterDescription,_std::allocator<Catch::ReporterDescription>_>
                    *)local_c8,(ReporterDescription *)local_118);
        if ((_Rb_tree_node_base *)local_f8._0_8_ != &local_e8) {
          operator_delete((void *)local_f8._0_8_,(ulong)(local_e8._0_8_ + 1));
        }
        if ((pointer)local_118._0_8_ != (pointer)local_108) {
          operator_delete((void *)local_118._0_8_,(ulong)(local_108._0_8_ + 1));
        }
        p_Var11 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var11);
      } while (p_Var11 != (_Rb_tree_node_base *)(lVar2 + 0x20));
    }
    (**(code **)(*(long *)local_e8._M_right + 0xa0))(local_e8._M_right,local_c8);
    pCVar13 = local_90;
    std::vector<Catch::ReporterDescription,_std::allocator<Catch::ReporterDescription>_>::~vector
              ((vector<Catch::ReporterDescription,_std::allocator<Catch::ReporterDescription>_> *)
               local_c8);
    cVar12 = '\x01';
  }
  if ((pCVar13->m_data).listListeners == true) {
    local_c8 = (undefined1  [8])0x0;
    _Stack_c0._0_8_ = (pointer)0x0;
    _Stack_c0._M_parent = (_Base_ptr)0x0;
    pSVar7 = Singleton<Catch::(anonymous_namespace)::RegistryHub,_Catch::IRegistryHub,_Catch::IMutableRegistryHub>
             ::getInternal();
    iVar5 = (*(pSVar7->super_RegistryHub).super_IRegistryHub._vptr_IRegistryHub[2])(pSVar7);
    plVar3 = *(long **)CONCAT44(extraout_var_04,iVar5);
    if (plVar3 == (long *)0x0) {
LAB_0014d3a7:
      SVar16.m_size = local_118._8_8_;
      SVar16.m_start = (char *)local_118._0_8_;
      __function = 
      "const T *Catch::Detail::unique_ptr<Catch::ReporterRegistry::ReporterRegistryImpl>::operator->() const [T = Catch::ReporterRegistry::ReporterRegistryImpl]"
      ;
LAB_0014d39d:
      local_118 = (undefined1  [16])SVar16;
      __assert_fail("m_ptr",
                    "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/test/catch_amalgamated.hpp"
                    ,0x389,__function);
    }
    std::vector<Catch::ListenerDescription,_std::allocator<Catch::ListenerDescription>_>::reserve
              ((vector<Catch::ListenerDescription,_std::allocator<Catch::ListenerDescription>_> *)
               local_c8,plVar3[1] - *plVar3 >> 3);
    plVar14 = (long *)*plVar3;
    plVar3 = (long *)plVar3[1];
    if (plVar14 != plVar3) {
      SVar16 = (StringRef)local_118;
      do {
        if ((long *)*plVar14 == (long *)0x0) {
LAB_0014d371:
          __function = 
          "const T *Catch::Detail::unique_ptr<Catch::EventListenerFactory>::operator->() const [T = Catch::EventListenerFactory]"
          ;
          goto LAB_0014d39d;
        }
        local_118 = (undefined1  [16])SVar16;
        SVar16 = (StringRef)(**(code **)(*(long *)*plVar14 + 0x18))();
        if ((long *)*plVar14 == (long *)0x0) goto LAB_0014d371;
        local_118 = (undefined1  [16])SVar16;
        (**(code **)(*(long *)*plVar14 + 0x20))(local_108);
        std::vector<Catch::ListenerDescription,_std::allocator<Catch::ListenerDescription>_>::
        emplace_back<Catch::ListenerDescription>
                  ((vector<Catch::ListenerDescription,_std::allocator<Catch::ListenerDescription>_>
                    *)local_c8,(ListenerDescription *)local_118);
        if ((pointer)local_108._0_8_ != (pointer)local_f8) {
          operator_delete((void *)local_108._0_8_,(ulong)(local_f8._0_8_ + 1));
        }
        plVar14 = plVar14 + 1;
        SVar16 = (StringRef)local_118;
      } while (plVar14 != plVar3);
    }
    (**(code **)(*(long *)local_e8._M_right + 0xa8))(local_e8._M_right,local_c8);
    std::vector<Catch::ListenerDescription,_std::allocator<Catch::ListenerDescription>_>::~vector
              ((vector<Catch::ListenerDescription,_std::allocator<Catch::ListenerDescription>_> *)
               local_c8);
    cVar12 = '\x01';
  }
  return (bool)cVar12;
}

Assistant:

bool list( IEventListener& reporter, Config const& config ) {
        bool listed = false;
        if (config.listTests()) {
            listed = true;
            listTests(reporter, config);
        }
        if (config.listTags()) {
            listed = true;
            listTags(reporter, config);
        }
        if (config.listReporters()) {
            listed = true;
            listReporters(reporter);
        }
        if ( config.listListeners() ) {
            listed = true;
            listListeners( reporter );
        }
        return listed;
    }